

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::ConvertToGrayScale
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  ConvertToGrayScaleForm4 p_Var1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  Image *pIVar4;
  Image *pIVar5;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  ImageManager manager;
  ConvertToGrayScaleForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  ConvertToGrayScaleForm4 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  uint8_t uVar6;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed0;
  ImageTypeManager *in_stack_fffffffffffffef0;
  FunctionTableHolder *in_stack_fffffffffffffef8;
  ImageTypeManager *this_00;
  ImageManager *in_stack_ffffffffffffff08;
  Image *in_stack_ffffffffffffff20;
  ImageManager *in_stack_ffffffffffffff28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68 [2];
  char *in_stack_ffffffffffffffa8;
  _func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
  *in_stack_ffffffffffffffb0;
  ConvertToGrayScaleForm4 local_38;
  
  this = ImageTypeManager::instance();
  this_00 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable
                     (this_00,(uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38));
  local_38 = pFVar3->ConvertToGrayScale;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_38 == (ConvertToGrayScaleForm4)0x0) &&
     (bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar2)) {
    ImageTypeManager::imageTypes((ImageTypeManager *)in_stack_fffffffffffffef8);
    local_68[0]._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    while( true ) {
      uVar6 = (uint8_t)((ulong)in_stack_fffffffffffffef8 >> 0x38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (!bVar2) break;
      in_stack_fffffffffffffef0 = this;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(local_68);
      in_stack_fffffffffffffef8 = ImageTypeManager::functionTable(this_00,uVar6);
      p_Var1 = in_stack_fffffffffffffef8->ConvertToGrayScale;
      if (p_Var1 != (ConvertToGrayScaleForm4)0x0) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator*(local_68);
        local_38 = p_Var1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(local_68);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffed0);
  }
  uVar6 = (uint8_t)((uint)in_stack_fffffffffffffebc >> 0x18);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),uVar6);
  pIVar4 = anon_unknown.dwarf_84a6f::ImageManager::operator()
                     (in_stack_ffffffffffffff08,(Image *)this_00);
  pIVar5 = anon_unknown.dwarf_84a6f::ImageManager::operator()
                     (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  (*local_38)(pIVar4,in_ESI,in_EDX,pIVar5,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager((ImageManager *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void ConvertToGrayScale( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                             uint32_t width, uint32_t height )
    {
        initialize( in, ConvertToGrayScale )
        func( manager(in), startXIn, startYIn, manager(out), startXOut, startYOut, width, height );
    }